

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_adf.cc
# Opt level: O0

void CB_ADF::finish(cb_adf *data)

{
  v_array<COST_SENSITIVE::wclass> *pvVar1;
  long in_RDI;
  vector<example_*,_std::allocator<example_*>_> *unaff_retaddr;
  size_t i;
  v_array<CB::label> *in_stack_fffffffffffffff0;
  v_array<COST_SENSITIVE::wclass> *pvVar2;
  v_array<COST_SENSITIVE::wclass> *this;
  
  std::vector<example_*,_std::allocator<example_*>_>::~vector(unaff_retaddr);
  v_array<CB::label>::delete_v(in_stack_fffffffffffffff0);
  pvVar2 = (v_array<COST_SENSITIVE::wclass> *)0x0;
  while( true ) {
    this = pvVar2;
    pvVar1 = (v_array<COST_SENSITIVE::wclass> *)
             v_array<COST_SENSITIVE::label>::size((v_array<COST_SENSITIVE::label> *)(in_RDI + 0xb8))
    ;
    if (pvVar1 <= pvVar2) break;
    v_array<COST_SENSITIVE::label>::operator[]
              ((v_array<COST_SENSITIVE::label> *)(in_RDI + 0xb8),(size_t)this);
    v_array<COST_SENSITIVE::wclass>::delete_v(this);
    pvVar2 = (v_array<COST_SENSITIVE::wclass> *)((long)&this->_begin + 1);
  }
  v_array<COST_SENSITIVE::label>::delete_v((v_array<COST_SENSITIVE::label> *)this);
  v_array<COST_SENSITIVE::wclass>::delete_v(this);
  v_array<unsigned_int>::delete_v((v_array<unsigned_int> *)this);
  v_array<unsigned_int>::delete_v((v_array<unsigned_int> *)this);
  v_array<ACTION_SCORE::action_score>::delete_v((v_array<ACTION_SCORE::action_score> *)this);
  v_array<ACTION_SCORE::action_score>::delete_v((v_array<ACTION_SCORE::action_score> *)this);
  v_array<COST_SENSITIVE::wclass>::delete_v(this);
  return;
}

Assistant:

void finish(cb_adf& data)
{
  data.gen_cs.mtr_ec_seq.~multi_ex();
  data.cb_labels.delete_v();
  for (size_t i = 0; i < data.prepped_cs_labels.size(); i++) data.prepped_cs_labels[i].costs.delete_v();
  data.prepped_cs_labels.delete_v();
  data.cs_labels.costs.delete_v();
  data.backup_weights.delete_v();
  data.backup_nf.delete_v();
  data.prob_s.delete_v();

  data.a_s.delete_v();
  data.gen_cs.pred_scores.costs.delete_v();
}